

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O1

int modrf_pos(int ord,double *coef,double a,double b,double *val,int invert)

{
  bool bVar1;
  double dVar2;
  uint uVar3;
  double *pdVar4;
  int iVar5;
  double *pdVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double local_88;
  undefined4 local_78;
  undefined4 local_58;
  undefined4 local_48;
  
  pdVar6 = coef + ord;
  auVar9._8_8_ = b;
  auVar9._0_8_ = a;
  auVar9 = divpd(_DAT_0066f4b0,auVar9);
  uVar3 = (uint)(invert == 0);
  auVar11._0_8_ = CONCAT44((int)(uVar3 << 0x1f) >> 0x1f,(int)(uVar3 << 0x1f) >> 0x1f);
  auVar11._8_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar11._12_4_ = (int)(uVar3 << 0x1f) >> 0x1f;
  auVar7._0_8_ = (ulong)b & auVar11._0_8_;
  auVar7._8_8_ = (ulong)a & auVar11._8_8_;
  auVar12._0_8_ = ~auVar11._0_8_ & (ulong)auVar9._0_8_;
  dVar16 = auVar9._8_8_;
  auVar12._8_8_ = ~auVar11._8_8_ & (ulong)dVar16;
  auVar13 = auVar12 | auVar7;
  if (invert == 0) {
    dVar14 = *pdVar6;
    dVar15 = dVar14;
    pdVar4 = pdVar6;
    while (pdVar4 = pdVar4 + -1, coef <= pdVar4) {
      dVar14 = dVar14 * auVar13._0_8_ + *pdVar4;
      dVar15 = dVar15 * auVar13._8_8_ + *pdVar4;
    }
  }
  else {
    dVar14 = *coef;
    dVar15 = dVar14;
    if (0 < ord) {
      pdVar4 = coef + 1;
      do {
        dVar14 = dVar14 * auVar13._0_8_ + *pdVar4;
        dVar15 = dVar15 * auVar13._8_8_ + *pdVar4;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 <= pdVar6);
    }
  }
  iVar5 = 0;
  if (dVar15 * dVar14 <= 0.0) {
    if ((ABS(dVar15) < 1e-12) || (a = b, dVar16 = auVar9._0_8_, ABS(dVar14) < 1e-12)) {
      if (invert != 0) {
        a = 1.0 / dVar16;
      }
      *val = a;
LAB_00654223:
      iVar5 = 1;
    }
    else {
      iVar5 = 0;
      dVar16 = dVar15;
      do {
        dVar10 = (auVar13._8_8_ * dVar14 - auVar13._0_8_ * dVar16) / (dVar14 - dVar16);
        if (invert == 0) {
          dVar17 = *pdVar6;
          pdVar4 = pdVar6;
          while (pdVar4 = pdVar4 + -1, coef <= pdVar4) {
            dVar17 = dVar17 * dVar10 + *pdVar4;
          }
        }
        else {
          dVar17 = *coef;
          pdVar4 = coef + 1;
          if (0 < ord) {
            do {
              dVar17 = dVar17 * dVar10 + *pdVar4;
              pdVar4 = pdVar4 + 1;
            } while (pdVar4 <= pdVar6);
          }
        }
        if (((1e-12 < ABS(dVar10)) && (ABS(dVar17 / dVar10) < 1e-12)) || (ABS(dVar17) < 1e-12)) {
LAB_006543af:
          if (invert != 0) {
            dVar10 = 1.0 / dVar10;
          }
          *val = dVar10;
          bVar1 = false;
          dVar2 = dVar15;
        }
        else {
          if (0.0 <= dVar16 * dVar17) {
            auVar13._8_8_ = dVar10;
            dVar16 = dVar17;
            if (0.0 < dVar15 * dVar17) {
              dVar14 = dVar14 * 0.5;
            }
          }
          else {
            auVar13._0_8_ = dVar10;
            dVar14 = dVar17;
            if (0.0 < dVar15 * dVar17) {
              dVar16 = dVar16 * 0.5;
            }
          }
          dVar10 = auVar13._8_8_;
          bVar1 = true;
          dVar2 = dVar17;
          if (ABS(auVar13._0_8_ - dVar10) < ABS(dVar10 * 1e-12)) goto LAB_006543af;
        }
        dVar15 = dVar2;
        if (!bVar1) goto LAB_00654223;
        iVar5 = iVar5 + 1;
      } while (iVar5 != 800);
      dVar10 = auVar13._8_8_;
      dVar15 = auVar13._0_8_;
      fprintf(_stderr,"modrf overflow on interval %f %f\n",auVar13._8_4_,dVar15);
      fprintf(_stderr,"\t b-a = %12.5e\n");
      local_58 = SUB84(dVar16,0);
      fprintf(_stderr,"\t fa  = %12.5e\n",local_58);
      local_48 = SUB84(dVar14,0);
      fprintf(_stderr,"\t fb  = %12.5e\n",local_48);
      local_78 = SUB84(dVar17,0);
      fprintf(_stderr,"\t fx  = %12.5e\n",local_78);
      if (invert == 0) {
        auVar8._8_8_ = *pdVar6;
        auVar8._0_8_ = *pdVar6;
        pdVar4 = pdVar6;
        while (pdVar4 = pdVar4 + -1, coef <= pdVar4) {
          dVar16 = auVar8._8_8_;
          auVar8._0_8_ = auVar8._0_8_ * dVar15 + *pdVar4;
          auVar8._8_8_ = dVar16 * dVar10 + *pdVar4;
        }
      }
      else {
        auVar8._8_8_ = *coef;
        auVar8._0_8_ = *coef;
        if (0 < ord) {
          pdVar4 = coef + 1;
          do {
            dVar16 = auVar8._8_8_;
            auVar8._0_8_ = auVar8._0_8_ * dVar15 + *pdVar4;
            auVar8._8_8_ = dVar16 * dVar10 + *pdVar4;
            pdVar4 = pdVar4 + 1;
          } while (pdVar4 <= pdVar6);
        }
      }
      fprintf(_stderr,"\t true fa = %12.5e\n");
      local_88._0_4_ = auVar8._0_4_;
      fprintf(_stderr,"\t true fb = %12.5e\n",local_88._0_4_);
      local_88 = auVar8._0_8_;
      fprintf(_stderr,"\t gradient= %12.5e\n",SUB84((local_88 - auVar8._8_8_) / (dVar15 - dVar10),0)
             );
      fwrite("Polynomial coefficients\n",0x18,1,_stderr);
      iVar5 = 0;
      if (-1 < ord) {
        do {
          fprintf(_stderr,"\t%12.5e\n",SUB84(*pdVar6,0));
          pdVar6 = pdVar6 + -1;
        } while (coef <= pdVar6);
      }
    }
  }
  return iVar5;
}

Assistant:

int modrf_pos( int ord, double *coef, double a, double b, 
	double *val, int invert)
   {
   int  its;
   double fx, lfx;
   double *fp;
   double *scoef = coef;
   double *ecoef = &coef[ord];
   double fa, fb;

   // Invert the interval if required
   if (invert)
      {
      double temp = a;
      a = 1.0 / b;
      b = 1.0 / temp;
      }

   // Evaluate the polynomial at the end points
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   // if there is no sign difference the method won't work
   if (fa * fb > 0.0)
      return(0);

   // Return if the values are close to zero already
   if (fabs(fa) < RELERROR) 
      {
      *val = invert ? 1.0/a : a;
      return(1);
      }

   if (fabs(fb) < RELERROR) 
      {
      *val = invert ? 1.0/b : b;
      return(1);
      }

   lfx = fa;

   for (its = 0; its < MAXIT; its++) 
      {
      // Assuming straight line from a to b, find zero
      double x = (fb * a - fa * b) / (fb - fa);

      // Evaluate the polynomial at x
      if (invert)
         {
         fx = *scoef;
         for (fp = scoef + 1; fp <= ecoef; fp++)
            fx = x * fx + *fp;
	 }
      else
         {
         fx = *ecoef;
         for (fp = ecoef - 1; fp >= scoef; fp--)
            fx = x * fx + *fp;
         }

      // Evaluate two stopping conditions
      if (fabs(x) > RELERROR && fabs(fx/x) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }
      else if (fabs(fx) < RELERROR) 
         {
         *val = invert ? 1.0/x : x;
         return(1);
         }

      // Subdivide region, depending on whether fx has same sign as fa or fb
      if ((fa * fx) < 0) 
         {
         b = x;
         fb = fx;
         if ((lfx * fx) > 0)
            fa /= 2;
         } 
      else 
         {
         a = x;
         fa = fx;
         if ((lfx * fx) > 0)
            fb /= 2;
         }

   
      // Return if the difference between a and b is very small
      if (fabs(b-a) < fabs(RELERROR * a))
         {
         *val = invert ? 1.0/a : a;
         return(1);
         }

      lfx = fx;
      }

   //==================================================================
   // This is debugging in case something goes wrong.
   // If we reach here, we have not converged -- give some diagnostics
   //==================================================================

   fprintf(stderr, "modrf overflow on interval %f %f\n", a, b);
   fprintf(stderr, "\t b-a = %12.5e\n", b-a);
   fprintf(stderr, "\t fa  = %12.5e\n", fa);
   fprintf(stderr, "\t fb  = %12.5e\n", fb);
   fprintf(stderr, "\t fx  = %12.5e\n", fx);

   // Evaluate the true values at a and b
   if (invert)
      {
      fb = fa = *scoef;
      for (fp = scoef + 1; fp <= ecoef; fp++)
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }
   else
      {
      fb = fa = *ecoef;
      for (fp = ecoef - 1; fp >= scoef; fp--) 
         {
         fa = a * fa + *fp;
         fb = b * fb + *fp;
         }
      }

   fprintf(stderr, "\t true fa = %12.5e\n", fa);
   fprintf(stderr, "\t true fb = %12.5e\n", fb);
   fprintf(stderr, "\t gradient= %12.5e\n", (fb-fa)/(b-a));

   // Print out the polynomial
   fprintf(stderr, "Polynomial coefficients\n");
   for (fp = ecoef; fp >= scoef; fp--) 
      fprintf (stderr, "\t%12.5e\n", *fp);

   return(0);
   }